

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcTiming.c
# Opt level: O3

int Abc_ObjLevelNew(Abc_Obj_t *pObj)

{
  int iVar1;
  long lVar2;
  int iVar3;
  float fVar4;
  float fVar5;
  
  iVar1 = (pObj->vFanins).nSize;
  if ((long)iVar1 < 1) {
    iVar3 = 0;
  }
  else {
    lVar2 = 0;
    iVar3 = 0;
    do {
      fVar5 = (float)(*(uint *)((long)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar2]] +
                               0x14) >> 0xc);
      fVar4 = (float)iVar3;
      if ((float)iVar3 <= fVar5) {
        fVar4 = fVar5;
      }
      iVar3 = (int)fVar4;
      lVar2 = lVar2 + 1;
    } while (iVar1 != lVar2);
  }
  return (uint)(0 < iVar1) + iVar3;
}

Assistant:

int Abc_ObjLevelNew( Abc_Obj_t * pObj )
{
    Abc_Obj_t * pFanin;
    int i, Level = 0;
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Level = Abc_MaxFloat( Level, Abc_ObjLevel(pFanin) );
    return Level + (int)(Abc_ObjFaninNum(pObj) > 0);
}